

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Instruction *i,bool sparse,bool *forward
          ,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  ushort uVar1;
  uint32_t id;
  uint *puVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  MSLSamplerYCbCrModelConversion MVar6;
  uint32_t *puVar7;
  SPIRType *pSVar8;
  SPIRVariable *pSVar9;
  MSLConstexprSampler *this_00;
  CompilerError *pCVar10;
  undefined7 in_register_00000009;
  uint32_t id_00;
  char (*ts_2) [2];
  long lVar11;
  uint32_t temp_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  SmallVector<unsigned_int,_8UL> *__range4;
  uint local_b4;
  uint32_t local_b0;
  undefined4 local_ac;
  string inner_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  SPIRType *local_60;
  char (*local_58) [2];
  string local_50;
  
  local_ac = (undefined4)CONCAT71(in_register_00000009,sparse);
  __range4 = inherited_expressions;
  local_58 = (char (*) [2])forward;
  puVar7 = Compiler::stream((Compiler *)this,i);
  local_b0 = *puVar7;
  id = puVar7[2];
  local_60 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_b0);
  uVar1 = i->op;
  pSVar8 = Compiler::expression_type((Compiler *)this,id);
  pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar8->super_IVariant).self.id);
  pSVar9 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
  local_b4 = (uint)uVar1;
  if (pSVar9 == (SPIRVariable *)0x0) {
    bVar4 = false;
    this_00 = (MSLConstexprSampler *)0x0;
  }
  else {
    id_00 = (pSVar9->basevariable).id;
    if (id_00 == 0) {
      id_00 = (pSVar9->super_IVariant).self.id;
    }
    this_00 = find_constexpr_sampler(this,id_00);
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar9->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this_00 == (MSLConstexprSampler *)0x0) ||
     (this_00->ycbcr_conversion_enable != true || bVar4 != false)) {
    if (((this->msl_options).swizzle_texture_samples != true || (uVar1 & 0xfffe) == 0x60) ||
       (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,pSVar8), !bVar5 || bVar4 != false))
    goto LAB_002fe8dd;
    add_spv_func_and_recompile(this,SPVFuncImplTextureSwizzle);
  }
  else {
    MVar6 = this_00->ycbcr_model;
    switch(MVar6) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      goto switchD_002fe84e_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT709);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT601);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT2020);
      break;
    default:
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&inner_expr,"Invalid Y\'CbCr model conversion.",(allocator *)&local_e0);
      CompilerError::CompilerError(pCVar10,&inner_expr);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    MVar6 = this_00->ycbcr_model;
switchD_002fe84e_caseD_0:
    if (MVar6 == MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) goto LAB_002fe8dd;
    if (this_00->ycbcr_range == MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW) {
      add_spv_func_and_recompile(this,SPVFuncImplExpandITUNarrowRange);
    }
    else {
      if (this_00->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&inner_expr,"Invalid Y\'CbCr range.",(allocator *)&local_e0);
        CompilerError::CompilerError(pCVar10,&inner_expr);
        __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      add_spv_func_and_recompile(this,SPVFuncImplExpandITUFullRange);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002fe8dd:
  ts_2 = local_58;
  CompilerGLSL::to_texture_op_abi_cxx11_
            (&inner_expr,&this->super_CompilerGLSL,i,local_ac._0_1_,(bool *)local_58,__range4);
  if ((this_00 == (MSLConstexprSampler *)0x0) ||
     (this_00->ycbcr_conversion_enable != true || bVar4 != false)) {
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    if (((this->msl_options).swizzle_texture_samples == true && (uVar1 & 0xfffe) != 0x60) &&
       (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,pSVar8), bVar4 == false && bVar5))
    {
      to_swizzle_expression_abi_cxx11_(&local_50,this,id);
      ::std::operator+(&local_80,", ",&local_50);
      ::std::operator+(&local_e0,&local_80,")");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_50);
      this->used_swizzle_buffer = true;
    }
  }
  else {
    bVar4 = MSLConstexprSampler::swizzle_is_identity(this_00);
    if (bVar4) {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      bVar4 = MSLConstexprSampler::swizzle_has_one_or_zero(this_00);
      pSVar8 = local_60;
      if (bVar4) {
        temp_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        ts_2 = (char (*) [2])0x0;
        CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_b0,temp_id,&inner_expr,false,false);
        puVar2 = (__range4->super_VectorView<unsigned_int>).ptr;
        sVar3 = (__range4->super_VectorView<unsigned_int>).buffer_size;
        for (lVar11 = 0; sVar3 << 2 != lVar11; lVar11 = lVar11 + 4) {
          Compiler::inherit_expression_dependencies
                    ((Compiler *)this,temp_id,*(uint32_t *)((long)puVar2 + lVar11));
        }
        (__range4->super_VectorView<unsigned_int>).buffer_size = 0;
        SmallVector<unsigned_int,_8UL>::push_back(__range4,&temp_id);
        if ((local_b4 - 0x57 < 7) && ((0x55U >> (local_b4 - 0x57 & 0x1f) & 1) != 0)) {
          CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,temp_id);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_80,this,pSVar8,0);
        ::std::operator+(&local_e0,&local_80,"(");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_e0);
        ::std::__cxx11::string::~string((string *)&local_80);
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          switch(this_00->swizzle[lVar11]) {
          case MSL_COMPONENT_SWIZZLE_IDENTITY:
            CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,temp_id,true)
            ;
            ::std::operator+(&local_80,&local_50,".");
            ::std::operator+(&local_e0,&local_80,"rgba"[lVar11]);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            break;
          case MSL_COMPONENT_SWIZZLE_ZERO:
          case MSL_COMPONENT_SWIZZLE_ONE:
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            goto LAB_002fec54;
          case MSL_COMPONENT_SWIZZLE_R:
          case MSL_COMPONENT_SWIZZLE_G:
          case MSL_COMPONENT_SWIZZLE_B:
          case MSL_COMPONENT_SWIZZLE_A:
            CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,temp_id,true)
            ;
            ::std::operator+(&local_80,&local_50,".");
            ::std::operator+(&local_e0,&local_80,
                             "spvTextureSwizzle("[(long)(int)this_00->swizzle[lVar11] + 0x10]);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            break;
          default:
            pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_e0,"Invalid component swizzle.",(allocator *)&local_80);
            CompilerError::CompilerError(pCVar10,&local_e0);
            __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::~string((string *)&local_e0);
          ::std::__cxx11::string::~string((string *)&local_80);
          ::std::__cxx11::string::~string((string *)&local_50);
LAB_002fec54:
          if (lVar11 != 3) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        ::std::operator+(&local_e0,&inner_expr,".");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_e0);
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          if ((3 < this_00->swizzle[lVar11] - MSL_COMPONENT_SWIZZLE_R) &&
             (this_00->swizzle[lVar11] != MSL_COMPONENT_SWIZZLE_IDENTITY)) {
            pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_e0,"Invalid component swizzle.",(allocator *)&local_80);
            CompilerError::CompilerError(pCVar10,&local_e0);
            __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
    }
    if (this_00->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_e0,(spirv_cross *)0x3964bc,(char (*) [3])&this_00->bpc,(uint *)0x37f234,ts_2
                );
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_e0);
      if (this_00->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&inner_expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                  SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	uint32_t result_type_id = ops[0];
	uint32_t img = ops[2];
	auto &result_type = get<SPIRType>(result_type_id);
	auto op = static_cast<Op>(i.op);
	bool is_gather = (op == OpImageGather || op == OpImageDrefGather);

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string expr;
	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		// If this needs sampler Y'CbCr conversion, we need to do some additional
		// processing.
		switch (constexpr_sampler->ycbcr_model)
		{
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
			// Default
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT709);
			expr += "spvConvertYCbCrBT709(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT601);
			expr += "spvConvertYCbCrBT601(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT2020);
			expr += "spvConvertYCbCrBT2020(";
			break;
		default:
			SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
		}

		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			switch (constexpr_sampler->ycbcr_range)
			{
			case MSL_SAMPLER_YCBCR_RANGE_ITU_FULL:
				add_spv_func_and_recompile(SPVFuncImplExpandITUFullRange);
				expr += "spvExpandITUFullRange(";
				break;
			case MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW:
				add_spv_func_and_recompile(SPVFuncImplExpandITUNarrowRange);
				expr += "spvExpandITUNarrowRange(";
				break;
			default:
				SPIRV_CROSS_THROW("Invalid Y'CbCr range.");
			}
		}
	}
	else if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
	         !is_dynamic_img_sampler)
	{
		add_spv_func_and_recompile(SPVFuncImplTextureSwizzle);
		expr += "spvTextureSwizzle(";
	}

	string inner_expr = CompilerGLSL::to_texture_op(i, sparse, forward, inherited_expressions);

	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		if (!constexpr_sampler->swizzle_is_identity())
		{
			static const char swizzle_names[] = "rgba";
			if (!constexpr_sampler->swizzle_has_one_or_zero())
			{
				// If we can, do it inline.
				expr += inner_expr + ".";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
				}
			}
			else
			{
				// Otherwise, we need to emit a temporary and swizzle that.
				uint32_t temp_id = ir.increase_bound_by(1);
				emit_op(result_type_id, temp_id, inner_expr, false);
				for (auto &inherit : inherited_expressions)
					inherit_expression_dependencies(temp_id, inherit);
				inherited_expressions.clear();
				inherited_expressions.push_back(temp_id);

				switch (op)
				{
				case OpImageSampleDrefImplicitLod:
				case OpImageSampleImplicitLod:
				case OpImageSampleProjImplicitLod:
				case OpImageSampleProjDrefImplicitLod:
					register_control_dependent_expression(temp_id);
					break;

				default:
					break;
				}
				expr += type_to_glsl(result_type) + "(";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += to_expression(temp_id) + "." + swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_ZERO:
						expr += "0";
						break;
					case MSL_COMPONENT_SWIZZLE_ONE:
						expr += "1";
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += to_expression(temp_id) + "." +
						        swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
					if (c < 3)
						expr += ", ";
				}
				expr += ")";
			}
		}
		else
			expr += inner_expr;
		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			expr += join(", ", constexpr_sampler->bpc, ")");
			if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY)
				expr += ")";
		}
	}
	else
	{
		expr += inner_expr;
		if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
		    !is_dynamic_img_sampler)
		{
			// Add the swizzle constant from the swizzle buffer.
			expr += ", " + to_swizzle_expression(img) + ")";
			used_swizzle_buffer = true;
		}
	}

	return expr;
}